

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rastack.cpp
# Opt level: O1

Error __thiscall asmjit::v1_14::RAStackAllocator::calculateStackFrame(RAStackAllocator *this)

{
  int *piVar1;
  RAStackAllocator *pRVar2;
  byte bVar3;
  uint uVar4;
  long *plVar5;
  uint *puVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  long *plVar14;
  ZoneAllocator *allocator;
  RAStackAllocator *pRVar15;
  ulong uVar16;
  long *plVar17;
  RAStackAllocator *pRVar18;
  int iVar19;
  RAStackSlot *__tmp;
  long *plVar20;
  ulong uVar21;
  long lVar22;
  Error EVar23;
  ulong in_R11;
  char cVar24;
  uint uVar25;
  long *plVar26;
  long *plVar27;
  ZoneVectorBase *this_00;
  bool bVar28;
  bool bVar29;
  char cVar30;
  ulong local_448 [2];
  ZoneVectorBase local_438;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  
  plVar5 = *(long **)(this + 0x18);
  uVar21 = (ulong)*(uint *)(this + 0x20);
  if (uVar21 != 0) {
    plVar14 = (long *)0x0;
    do {
      lVar7 = *(long *)((long)plVar5 + (long)plVar14);
      bVar3 = *(byte *)(lVar7 + 1);
      if (bVar3 == 0) goto LAB_0012b353;
      uVar25 = 0;
      if (bVar3 != 0) {
        for (; (bVar3 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
        }
      }
      uVar11 = 6;
      if ((char)uVar25 != '\a') {
        uVar11 = uVar25;
      }
      if ((*(byte *)(lVar7 + 2) & 1) == 0) {
        uVar16 = (ulong)(uVar11 & 0xff);
      }
      else {
        uVar16 = (ulong)(byte)((byte)uVar11 ^ 7) * (ulong)*(uint *)(lVar7 + 8) + 0x10;
      }
      if (0xfffffffe < uVar16) {
        uVar16 = 0xffffffff;
      }
      *(int *)(lVar7 + 0xc) = (int)uVar16;
      plVar14 = plVar14 + 1;
    } while (uVar21 * 8 - (long)plVar14 != 0);
  }
  plVar14 = plVar5 + uVar21;
  lVar7 = 0;
LAB_0012af74:
  uVar16 = (long)plVar14 - (long)plVar5 >> 3;
  if (7 < uVar16) {
    plVar27 = plVar5 + 1;
    plVar17 = plVar14 + -1;
    lVar8 = *(long *)((long)plVar5 + (uVar16 & 0xfffffffffffffffe) * 4);
    *(long *)((long)plVar5 + (uVar16 & 0xfffffffffffffffe) * 4) = *plVar5;
    *plVar5 = lVar8;
    lVar8 = plVar5[1];
    if (*(uint *)(plVar14[-1] + 0xc) < *(uint *)(lVar8 + 0xc)) {
      *plVar27 = plVar14[-1];
      *plVar17 = lVar8;
    }
    lVar8 = *plVar5;
    if (*(uint *)(*plVar17 + 0xc) < *(uint *)(lVar8 + 0xc)) {
      *plVar5 = *plVar17;
      *plVar17 = lVar8;
    }
    lVar8 = plVar5[1];
    if (*(uint *)(*plVar5 + 0xc) < *(uint *)(lVar8 + 0xc)) {
      plVar5[1] = *plVar5;
      *plVar5 = lVar8;
    }
LAB_0012aff6:
    if (plVar27 < plVar17) goto code_r0x0012affb;
    goto LAB_0012b010;
  }
  if ((plVar5 != plVar14) && (1 < (long)uVar16)) {
    plVar27 = plVar5 + 1;
    plVar17 = plVar27;
joined_r0x0012b098:
    do {
      if (plVar5 < plVar27) {
        lVar8 = plVar27[-1];
        uVar25 = *(uint *)(lVar8 + 0xc);
        in_R11 = (ulong)uVar25;
        if (*(uint *)(*plVar27 + 0xc) < uVar25) {
          plVar27[-1] = *plVar27;
          *plVar27 = lVar8;
          plVar27 = plVar27 + -1;
          goto joined_r0x0012b098;
        }
      }
      plVar27 = plVar17 + 1;
      plVar17 = plVar27;
    } while (plVar27 < (long *)(((long)plVar14 - (long)plVar5) + (long)plVar5));
  }
  EVar23 = (Error)in_R11;
  if (lVar7 != 0) {
    plVar5 = *(long **)((long)local_448 + lVar7);
    plVar14 = *(long **)((long)local_448 + lVar7 + 8);
    lVar7 = lVar7 + -0x10;
    goto LAB_0012af74;
  }
  local_3e8 = 0;
  uStack_3e0 = 0;
  local_3f8 = 0;
  uStack_3f0 = 0;
  local_408 = 0;
  uStack_400 = 0;
  local_418 = 0;
  uStack_410 = 0;
  local_428 = 0;
  uStack_420 = 0;
  local_438._data = (void *)0x0;
  local_438._size = 0;
  local_438._capacity = 0;
  bVar28 = uVar21 == 0;
  if (bVar28) {
    iVar19 = -1;
  }
  else {
    pRVar18 = *(RAStackAllocator **)(this + 0x18);
    pRVar2 = pRVar18 + uVar21 * 8;
    uVar21 = 0;
    do {
      lVar7 = *(long *)pRVar18;
      cVar24 = '\a';
      if ((*(byte *)(lVar7 + 2) & 2) == 0) {
        bVar3 = *(byte *)(lVar7 + 1);
        uVar25 = *(uint *)(lVar7 + 4);
        allocator = (ZoneAllocator *)(ulong)uVar25;
        iVar19 = 0;
        if (uVar25 < 0x40) {
          uVar11 = 0;
          if (uVar25 != 0) {
            for (; (uVar25 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
            }
          }
          puVar6 = (uint *)((long)&local_438._size + (ulong)(uVar11 << 4));
          lVar8 = 0;
          if ((ulong)uVar11 < 6) {
            lVar8 = 5 - (ulong)uVar11;
          }
          lVar8 = lVar8 + 1;
          do {
            bVar29 = *puVar6 != 0;
            if (bVar29) {
              uVar11 = *puVar6 - 1;
              pRVar15 = (RAStackAllocator *)(ulong)uVar11;
              *puVar6 = uVar11;
              uVar11 = *(uint *)(*(long *)(puVar6 + -2) + (long)pRVar15 * 8);
              if (uVar11 % (uint)bVar3 != 0) goto LAB_0012b35d;
              iVar19 = *(int *)(*(long *)(puVar6 + -2) + 4 + (long)pRVar15 * 8);
              *(uint *)(lVar7 + 0x10) = uVar11;
              iVar19 = iVar19 - uVar25;
              uVar16 = (ulong)(uVar11 - uVar25);
              goto LAB_0012b1c7;
            }
            puVar6 = puVar6 + 4;
            lVar8 = lVar8 + -1;
          } while (lVar8 != 0);
          uVar16 = 0;
        }
        else {
          bVar29 = false;
          uVar16 = 0;
        }
LAB_0012b1c7:
        local_448[1] = (ulong)bVar3;
        uVar11 = -(uint)bVar3 & ((int)uVar21 + (uint)bVar3) - 1;
        iVar9 = uVar11 - (int)uVar21;
        iVar10 = iVar9;
        if (iVar9 == 0 || bVar29) {
          iVar10 = iVar19;
        }
        uVar21 = uVar21 & 0xffffffff;
        if (!bVar29) {
          uVar21 = (ulong)uVar11;
        }
        if (iVar10 != 0) {
          uVar13 = (ulong)uVar11;
          if (iVar9 == 0 || bVar29) {
            uVar13 = uVar16;
          }
          uVar11 = iVar10 + (int)uVar13;
          do {
            uVar25 = (uint)allocator;
            uVar12 = (uint)uVar13;
            cVar24 = '\0';
            if (uVar11 <= uVar12) goto LAB_0012b2cf;
            iVar19 = 0;
            if (uVar12 != 0) {
              for (; (uVar12 >> iVar19 & 1) == 0; iVar19 = iVar19 + 1) {
              }
            }
            uVar25 = 1 << ((byte)iVar19 & 0x1f);
            cVar30 = '\r';
            if (uVar25 <= uVar11 - uVar12) {
              uVar16 = (ulong)(uint)(iVar19 << 4);
              this_00 = (ZoneVectorBase *)((long)&local_438._data + uVar16);
              if (*(int *)((long)&local_438._size + uVar16) ==
                  *(int *)((long)&local_438._capacity + uVar16)) {
                allocator = *(ZoneAllocator **)this;
                local_448[0] = uVar21;
                uVar4 = ZoneVectorBase::_grow(this_00,allocator,8,1);
                in_R11 = in_R11 & 0xffffffff;
                uVar21 = local_448[0];
                if (uVar4 == 0) goto LAB_0012b235;
              }
              else {
LAB_0012b235:
                allocator = (ZoneAllocator *)(uVar13 | (ulong)uVar25 << 0x20);
                *(ZoneAllocator **)
                 ((long)this_00->_data + (ulong)*(uint *)((long)&local_438._size + uVar16) * 8) =
                     allocator;
                piVar1 = (int *)((long)&local_438._size + uVar16);
                *piVar1 = *piVar1 + 1;
                uVar4 = 0;
              }
              cVar30 = uVar4 != 0;
              in_R11 = in_R11 & 0xffffffff;
              if ((bool)cVar30) {
                in_R11 = (ulong)uVar4;
                uVar25 = 0;
              }
              uVar13 = (ulong)(uVar25 + uVar12);
            }
            uVar25 = (uint)allocator;
          } while (cVar30 == '\0');
          cVar24 = '\0';
          if (cVar30 != '\r') {
            cVar24 = cVar30;
          }
LAB_0012b2cf:
          if (cVar24 != '\0') goto LAB_0012b2f6;
        }
        cVar24 = '\0';
        if (!bVar29) {
          pRVar15 = pRVar2;
          if ((int)((uVar21 & 0xffffffff) % (local_448[1] & 0xffffffff)) != 0) goto LAB_0012b358;
          *(int *)(lVar7 + 0x10) = (int)uVar21;
          uVar21 = (ulong)(uint)((int)uVar21 + *(int *)(lVar7 + 4));
        }
      }
LAB_0012b2f6:
      EVar23 = (Error)in_R11;
      if ((cVar24 != '\a') && (cVar24 != '\0')) break;
      pRVar18 = pRVar18 + 8;
      bVar28 = pRVar18 == pRVar2;
    } while (!bVar28);
    iVar19 = (int)uVar21 + -1;
  }
  if (bVar28) {
    *(int *)(this + 0xc) = -*(int *)(this + 0x10) & iVar19 + *(int *)(this + 0x10);
    EVar23 = 0;
  }
  return EVar23;
code_r0x0012affb:
  plVar26 = plVar27 + 1;
  plVar27 = plVar27 + 1;
  if (*(uint *)(*plVar26 + 0xc) < *(uint *)(*plVar5 + 0xc)) goto LAB_0012aff6;
LAB_0012b010:
  do {
    if (plVar17 <= plVar5) break;
    plVar26 = plVar17 + -1;
    plVar17 = plVar17 + -1;
  } while (*(uint *)(*plVar5 + 0xc) < *(uint *)(*plVar26 + 0xc));
  if (plVar27 <= plVar17) {
    lVar8 = *plVar27;
    *plVar27 = *plVar17;
    *plVar17 = lVar8;
    goto LAB_0012aff6;
  }
  lVar8 = *plVar5;
  lVar22 = (long)plVar17 - (long)plVar5;
  in_R11 = (long)plVar14 - (long)plVar27;
  plVar26 = plVar27;
  if ((long)in_R11 < lVar22) {
    plVar26 = plVar5;
  }
  *plVar5 = *plVar17;
  plVar20 = plVar14;
  if ((long)in_R11 < lVar22) {
    plVar20 = plVar17;
  }
  *plVar17 = lVar8;
  *(long **)((long)&local_438._data + lVar7) = plVar26;
  *(long **)((long)&local_438._size + lVar7) = plVar20;
  if (lVar7 < 0x3f1) {
    if ((long)in_R11 < lVar22) {
      plVar5 = plVar27;
      plVar17 = plVar14;
    }
    plVar14 = plVar17;
    lVar7 = lVar7 + 0x10;
    goto LAB_0012af74;
  }
  calculateStackFrame();
LAB_0012b353:
  uVar25 = (uint)plVar14;
  calculateStackFrame();
  pRVar15 = this;
LAB_0012b358:
  calculateStackFrame();
LAB_0012b35d:
  calculateStackFrame();
  uVar11 = *(uint *)(pRVar15 + 0x20);
  if ((ulong)uVar11 != 0) {
    lVar7 = *(long *)(pRVar15 + 0x18);
    lVar8 = 0;
    do {
      if ((*(byte *)(*(long *)(lVar7 + lVar8) + 2) & 2) == 0) {
        piVar1 = (int *)(*(long *)(lVar7 + lVar8) + 0x10);
        *piVar1 = *piVar1 + uVar25;
      }
      lVar8 = lVar8 + 8;
    } while ((ulong)uVar11 << 3 != lVar8);
  }
  return 0;
}

Assistant:

Error RAStackAllocator::calculateStackFrame() noexcept {
  // Base weight added to all registers regardless of their size and alignment.
  uint32_t kBaseRegWeight = 16;

  // STEP 1:
  //
  // Update usage based on the size of the slot. We boost smaller slots in a way that 32-bit register has a higher
  // priority than a 128-bit register, however, if one 128-bit register is used 4 times more than some other 32-bit
  // register it will overweight it.
  for (RAStackSlot* slot : _slots) {
    uint32_t alignment = slot->alignment();
    ASMJIT_ASSERT(alignment > 0);

    uint32_t power = Support::min<uint32_t>(Support::ctz(alignment), 6);
    uint64_t weight;

    if (slot->isRegHome())
      weight = kBaseRegWeight + (uint64_t(slot->useCount()) * (7 - power));
    else
      weight = power;

    // If overflown, which has less chance of winning a lottery, just use max possible weight. In such case it
    // probably doesn't matter at all.
    if (weight > 0xFFFFFFFFu)
      weight = 0xFFFFFFFFu;

    slot->setWeight(uint32_t(weight));
  }

  // STEP 2:
  //
  // Sort stack slots based on their newly calculated weight (in descending order).
  _slots.sort([](const RAStackSlot* a, const RAStackSlot* b) noexcept {
    return a->weight() >  b->weight() ? 1 :
           a->weight() == b->weight() ? 0 : -1;
  });

  // STEP 3:
  //
  // Calculate offset of each slot. We start from the slot that has the highest weight and advance to slots with
  // lower weight. It could look that offsets start from the first slot in our list and then simply increase, but
  // it's not always the case as we also try to fill all gaps introduced by the fact that slots are sorted by
  // weight and not by size & alignment, so when we need to align some slot we distribute the gap caused by the
  // alignment to `gaps`.
  uint32_t offset = 0;
  ZoneVector<RAStackGap> gaps[kSizeCount - 1];

  for (RAStackSlot* slot : _slots) {
    if (slot->isStackArg())
      continue;

    uint32_t slotAlignment = slot->alignment();
    uint32_t alignedOffset = Support::alignUp(offset, slotAlignment);

    // Try to find a slot within gaps first, before advancing the `offset`.
    bool foundGap = false;
    uint32_t gapSize = 0;
    uint32_t gapOffset = 0;

    {
      uint32_t slotSize = slot->size();
      if (slotSize < (1u << uint32_t(ASMJIT_ARRAY_SIZE(gaps)))) {
        // Iterate from the lowest to the highest possible.
        uint32_t index = Support::ctz(slotSize);
        do {
          if (!gaps[index].empty()) {
            RAStackGap gap = gaps[index].pop();

            ASMJIT_ASSERT(Support::isAligned(gap.offset, slotAlignment));
            slot->setOffset(int32_t(gap.offset));

            gapSize = gap.size - slotSize;
            gapOffset = gap.offset - slotSize;

            foundGap = true;
            break;
          }
        } while (++index < uint32_t(ASMJIT_ARRAY_SIZE(gaps)));
      }
    }

    // No gap found, we may create a new one(s) if the current offset is not aligned.
    if (!foundGap && offset != alignedOffset) {
      gapSize = alignedOffset - offset;
      gapOffset = alignedOffset;

      offset = alignedOffset;
    }

    // True if we have found a gap and not filled all of it or we aligned the current offset.
    if (gapSize) {
      uint32_t gapEnd = gapSize + gapOffset;
      while (gapOffset < gapEnd) {
        uint32_t index = Support::ctz(gapOffset);
        uint32_t slotSize = 1u << index;

        // Weird case, better to bail...
        if (gapEnd - gapOffset < slotSize)
          break;

        ASMJIT_PROPAGATE(gaps[index].append(allocator(), RAStackGap(gapOffset, slotSize)));
        gapOffset += slotSize;
      }
    }

    if (!foundGap) {
      ASMJIT_ASSERT(Support::isAligned(offset, slotAlignment));
      slot->setOffset(int32_t(offset));
      offset += slot->size();
    }
  }

  _stackSize = Support::alignUp(offset, _alignment);
  return kErrorOk;
}